

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alist.c
# Opt level: O3

int array_list_add(p_array_list alist,void *item)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  void **ppvVar4;
  
  if (alist->size != 0) {
    ppvVar4 = alist->array;
    uVar2 = 0;
    do {
      if (*ppvVar4 == (void *)0x0) goto LAB_00103719;
      uVar2 = uVar2 + 1;
      ppvVar4 = ppvVar4 + 1;
    } while (alist->size != uVar2);
  }
  sVar3 = expand_array_list(alist);
  uVar1 = (int)(sVar3 >> 1) + 1;
  uVar2 = (ulong)uVar1;
  ppvVar4 = alist->array + (int)uVar1;
LAB_00103719:
  *ppvVar4 = item;
  alist->count = alist->count + 1;
  return (int)uVar2;
}

Assistant:

int array_list_add(p_array_list alist, void* item) {
    for (int i = 0; i < alist->size; i++) {
        if (alist->array[i] == 0) {
            alist->array[i] = item;
            alist->count++;
            return i;
        }
    }
    int index = (int) ((expand_array_list(alist) / 2) + 1);
    alist->array[index] = item;
    alist->count++;
    return index;
}